

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_indexed(FuncState *fs,expdesc *t,expdesc *k)

{
  anon_struct_4_2_de3090fa_for_ind aVar1;
  int iVar2;
  expkind eVar3;
  TValue *io;
  Value local_28;
  byte local_20;
  
  if (k->k == VKSTR) {
    local_28 = (Value)(k->u).strval;
    local_20 = (local_28.gc)->tt | 0x40;
    iVar2 = addk(fs,(TValue *)&local_28,(TValue *)&local_28);
    (k->u).info = iVar2;
    k->k = VK;
    eVar3 = t->k;
    if (eVar3 != VUPVAL) goto LAB_001393dd;
LAB_001393a8:
    if (((k->t != k->f) || (0xff < (long)(k->u).info)) || (fs->f->k[(k->u).info].tt_ != 'D'))
    goto LAB_001393d0;
  }
  else {
    eVar3 = t->k;
    if (eVar3 == VUPVAL) {
      if (k->k == VK) goto LAB_001393a8;
LAB_001393d0:
      luaK_exp2anyreg(fs,t);
      eVar3 = t->k;
    }
LAB_001393dd:
    if ((eVar3 == VLOCAL) || (eVar3 != VUPVAL)) {
      (t->u).ind.t = (t->u).var.ridx;
      if (k->k == VKINT) {
        if ((k->t == k->f) && ((ulong)(k->u).ival < 0x100)) {
          (t->u).ind.idx = (short)(k->u).ival;
          eVar3 = VINDEXI;
          goto LAB_00139470;
        }
      }
      else if ((k->k == VK) && (k->t == k->f)) {
        aVar1 = (k->u).ind;
        if (((long)(int)aVar1 < 0x100) && (fs->f->k[(int)aVar1].tt_ == 'D')) {
          (t->u).ind.idx = aVar1.idx;
          eVar3 = VINDEXSTR;
          goto LAB_00139470;
        }
      }
      iVar2 = luaK_exp2anyreg(fs,k);
      (t->u).ind.idx = (short)iVar2;
      eVar3 = VINDEXED;
      goto LAB_00139470;
    }
  }
  (t->u).ind.t = (t->u).var.ridx;
  (t->u).ind.idx = (k->u).ind.idx;
  eVar3 = VINDEXUP;
LAB_00139470:
  t->k = eVar3;
  return;
}

Assistant:

void luaK_indexed (FuncState *fs, expdesc *t, expdesc *k) {
  if (k->k == VKSTR)
    str2K(fs, k);
  lua_assert(!hasjumps(t) &&
             (t->k == VLOCAL || t->k == VNONRELOC || t->k == VUPVAL));
  if (t->k == VUPVAL && !isKstr(fs, k))  /* upvalue indexed by non 'Kstr'? */
    luaK_exp2anyreg(fs, t);  /* put it in a register */
  if (t->k == VUPVAL) {
    t->u.ind.t = t->u.info;  /* upvalue index */
    t->u.ind.idx = k->u.info;  /* literal string */
    t->k = VINDEXUP;
  }
  else {
    /* register index of the table */
    t->u.ind.t = (t->k == VLOCAL) ? t->u.var.ridx: t->u.info;
    if (isKstr(fs, k)) {
      t->u.ind.idx = k->u.info;  /* literal string */
      t->k = VINDEXSTR;
    }
    else if (isCint(k)) {
      t->u.ind.idx = cast_int(k->u.ival);  /* int. constant in proper range */
      t->k = VINDEXI;
    }
    else {
      t->u.ind.idx = luaK_exp2anyreg(fs, k);  /* register */
      t->k = VINDEXED;
    }
  }
}